

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linked-list.cpp
# Opt level: O0

void __thiscall LinkedList::insert(LinkedList *this,Node **head,int newNumber,int beforeNumber)

{
  ostream *this_00;
  Node *__s;
  Node *newNode;
  Node *last;
  int beforeNumber_local;
  int newNumber_local;
  Node **head_local;
  LinkedList *this_local;
  
  newNode = *head;
  if (newNode == (Node *)0x0) {
    this_00 = std::operator<<((ostream *)&std::cout,"Empty Linked List");
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  }
  else {
    while (newNode != (Node *)0x0) {
      if (newNode->data == beforeNumber) {
        __s = (Node *)operator_new(0x10);
        memset(__s,0,0x10);
        __s->data = newNumber;
        if (newNode->next == (Node *)0x0) {
          __s->next = (Node *)0x0;
        }
        else {
          __s->next = newNode->next;
        }
        newNode->next = __s;
        if (beforeNumber != newNumber) goto LAB_00102f4e;
        newNode = newNode->next->next;
      }
      else {
LAB_00102f4e:
        newNode = newNode->next;
      }
    }
  }
  return;
}

Assistant:

void LinkedList::insert(Node** head, int newNumber, int beforeNumber) {
	Node* last = *head;

	if (last == nullptr) {
		std::cout << "Empty Linked List" << std::endl;
		return;
	}

	while (true) {
		if (last == nullptr) {
			break;
		}
		
		if (last->data == beforeNumber) {
			Node* newNode = new Node();
			newNode->data = newNumber;

			if (last->next == nullptr) {
				newNode->next = nullptr;
			} else {
				newNode->next = last->next;
			}

			last->next = newNode;

			if (beforeNumber == newNumber) {
				last = last->next->next;
				continue;
			}
		}
		
		last = last->next;
	}
}